

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

BOOL Js::JavascriptOperators::GetAccessors
               (RecyclableObject *instance,PropertyId propertyId,ScriptContext *requestContext,
               Var *getter,Var *setter)

{
  Type TVar1;
  int iVar2;
  BOOL BVar3;
  Var pvVar4;
  
  TVar1 = ((instance->type).ptr)->typeId;
  while( true ) {
    if (TVar1 == TypeIds_Null) {
      return 0;
    }
    iVar2 = (*(instance->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x15])
                      (instance,(ulong)(uint)propertyId,getter,setter,requestContext);
    if (iVar2 != 0) break;
    BVar3 = RecyclableObject::SkipsPrototype(instance);
    if (BVar3 != 0) {
      return 0;
    }
    instance = GetPrototype(instance);
    TVar1 = ((instance->type).ptr)->typeId;
  }
  pvVar4 = CanonicalizeAccessor(*getter,requestContext);
  *getter = pvVar4;
  pvVar4 = CanonicalizeAccessor(*setter,requestContext);
  *setter = pvVar4;
  return 1;
}

Assistant:

JavascriptOperators::GetAccessors(RecyclableObject* instance, PropertyId propertyId, ScriptContext* requestContext, _Out_ Var* getter, _Out_ Var* setter)
    {
        RecyclableObject* object = instance;
        while (!JavascriptOperators::IsNull(object))
        {
            if (object->GetAccessors(propertyId, getter, setter, requestContext))
            {
                *getter = JavascriptOperators::CanonicalizeAccessor(*getter, requestContext);
                *setter = JavascriptOperators::CanonicalizeAccessor(*setter, requestContext);
                return TRUE;
            }

            if (object->SkipsPrototype())
            {
                break;
            }
            object = JavascriptOperators::GetPrototype(object);
        }
        return FALSE;
    }